

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmdiarea.cpp
# Opt level: O0

void QMdiArea::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  TabShape TVar2;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QMdiSubWindow *in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QMdiArea *_t;
  QBrush *in_stack_ffffffffffffff78;
  QMdiAreaPrivate *in_stack_ffffffffffffff80;
  QBrush *in_stack_ffffffffffffff88;
  QMdiAreaPrivate *in_stack_ffffffffffffff90;
  QMdiAreaPrivate *in_stack_ffffffffffffff98;
  TabShape *pTVar3;
  QMdiAreaPrivate *in_stack_ffffffffffffffa0;
  QBrush local_30 [8];
  QMetaTypeInterface *local_28;
  QMetaType local_20;
  QMetaType local_18;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff88 = (QBrush *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff88) {
    case (QBrush *)0x0:
      subWindowActivated((QMdiArea *)0x615d22,(QMdiSubWindow *)in_stack_ffffffffffffff78);
      break;
    case (QBrush *)0x1:
      setActiveSubWindow((QMdiArea *)in_stack_ffffffffffffff80,in_RDI);
      break;
    case (QBrush *)0x2:
      tileSubWindows((QMdiArea *)in_stack_ffffffffffffff80);
      break;
    case (QBrush *)0x3:
      cascadeSubWindows((QMdiArea *)in_stack_ffffffffffffff80);
      break;
    case (QBrush *)0x4:
      closeActiveSubWindow((QMdiArea *)in_stack_ffffffffffffff80);
      break;
    case (QBrush *)0x5:
      closeAllSubWindows((QMdiArea *)in_stack_ffffffffffffff88);
      break;
    case (QBrush *)0x6:
      activateNextSubWindow((QMdiArea *)in_stack_ffffffffffffff80);
      break;
    case (QBrush *)0x7:
      activatePreviousSubWindow((QMdiArea *)in_stack_ffffffffffffff80);
      break;
    case (QBrush *)0x8:
      (**(code **)(*(long *)&in_RDI->super_QWidget + 0x1a8))();
      break;
    case (QBrush *)0x9:
      d_func((QMdiArea *)0x615dc5);
      QMdiAreaPrivate::_q_deactivateAllWindows
                (in_stack_ffffffffffffff98,(QMdiSubWindow *)in_stack_ffffffffffffff90);
      break;
    case (QBrush *)0xa:
      d_func((QMdiArea *)0x615de0);
      local_c = **(undefined4 **)(in_RCX + 8);
      local_10 = **(undefined4 **)(in_RCX + 0x10);
      QMdiAreaPrivate::_q_processWindowStateChanged
                (in_stack_ffffffffffffff98,
                 (QFlagsStorageHelper<Qt::WindowState,_4>)SUB84((ulong)in_RDI >> 0x20,0),
                 (QFlagsStorageHelper<Qt::WindowState,_4>)SUB84(in_RDI,0));
      break;
    case (QBrush *)0xb:
      d_func((QMdiArea *)0x615e1a);
      QMdiAreaPrivate::_q_currentTabChanged
                (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      break;
    case (QBrush *)0xc:
      d_func((QMdiArea *)0x615e39);
      QMdiAreaPrivate::_q_closeTab
                (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      break;
    case (QBrush *)0xd:
      d_func((QMdiArea *)0x615e58);
      QMdiAreaPrivate::_q_moveTab
                (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                 (int)in_stack_ffffffffffffff88);
    }
  }
  if (in_ESI == 7) {
    if (in_EDX == 8) {
      if (**(int **)(in_RCX + 8) == 0) {
        local_28 = (QMetaTypeInterface *)QMetaType::fromType<QWidget*>();
        **(undefined8 **)in_RCX = local_28;
      }
      else {
        memset(&local_20,0,8);
        QMetaType::QMetaType(&local_20);
        **(undefined8 **)in_RCX = local_20.d_ptr;
      }
    }
    else {
      memset(&local_18,0,8);
      QMetaType::QMetaType(&local_18);
      **(undefined8 **)in_RCX = local_18.d_ptr;
    }
  }
  if ((in_ESI != 5) ||
     (bVar1 = QtMocHelpers::indexOfMethod<void(QMdiArea::*)(QMdiSubWindow*)>
                        (in_RCX,(void **)subWindowActivated,0,0), !bVar1)) {
    if (in_ESI == 1) {
      pTVar3 = *(TabShape **)in_RCX;
      in_stack_ffffffffffffff80 = (QMdiAreaPrivate *)(ulong)in_EDX;
      switch(in_stack_ffffffffffffff80) {
      case (QMdiAreaPrivate *)0x0:
        background((QMdiArea *)in_stack_ffffffffffffff88);
        QBrush::operator=((QBrush *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        QBrush::~QBrush(local_30);
        break;
      case (QMdiAreaPrivate *)0x1:
        TVar2 = activationOrder((QMdiArea *)in_stack_ffffffffffffff80);
        *pTVar3 = TVar2;
        break;
      case (QMdiAreaPrivate *)0x2:
        TVar2 = viewMode((QMdiArea *)in_stack_ffffffffffffff80);
        *pTVar3 = TVar2;
        break;
      case (QMdiAreaPrivate *)0x3:
        bVar1 = documentMode((QMdiArea *)in_stack_ffffffffffffff80);
        *(bool *)pTVar3 = bVar1;
        break;
      case (QMdiAreaPrivate *)0x4:
        bVar1 = tabsClosable((QMdiArea *)in_stack_ffffffffffffff80);
        *(bool *)pTVar3 = bVar1;
        break;
      case (QMdiAreaPrivate *)0x5:
        bVar1 = tabsMovable((QMdiArea *)in_stack_ffffffffffffff80);
        *(bool *)pTVar3 = bVar1;
        break;
      case (QMdiAreaPrivate *)0x6:
        TVar2 = tabShape((QMdiArea *)in_stack_ffffffffffffff80);
        *pTVar3 = TVar2;
        break;
      case (QMdiAreaPrivate *)0x7:
        TVar2 = tabPosition((QMdiArea *)in_stack_ffffffffffffff80);
        *pTVar3 = TVar2;
      }
    }
    if (in_ESI == 2) {
      switch(in_EDX) {
      case 0:
        setBackground(*(QMdiArea **)in_RCX,in_stack_ffffffffffffff88);
        break;
      case 1:
        setActivationOrder((QMdiArea *)in_stack_ffffffffffffff80,CreationOrder);
        break;
      case 2:
        setViewMode((QMdiArea *)in_stack_ffffffffffffff80,SubWindowView);
        break;
      case 3:
        setDocumentMode((QMdiArea *)in_stack_ffffffffffffff80,false);
        break;
      case 4:
        setTabsClosable((QMdiArea *)in_stack_ffffffffffffff80,false);
        break;
      case 5:
        setTabsMovable((QMdiArea *)in_stack_ffffffffffffff80,false);
        break;
      case 6:
        setTabShape((QMdiArea *)in_stack_ffffffffffffff80,Rounded);
        break;
      case 7:
        setTabPosition((QMdiArea *)in_stack_ffffffffffffff80,North);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiArea::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMdiArea *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->subWindowActivated((*reinterpret_cast< std::add_pointer_t<QMdiSubWindow*>>(_a[1]))); break;
        case 1: _t->setActiveSubWindow((*reinterpret_cast< std::add_pointer_t<QMdiSubWindow*>>(_a[1]))); break;
        case 2: _t->tileSubWindows(); break;
        case 3: _t->cascadeSubWindows(); break;
        case 4: _t->closeActiveSubWindow(); break;
        case 5: _t->closeAllSubWindows(); break;
        case 6: _t->activateNextSubWindow(); break;
        case 7: _t->activatePreviousSubWindow(); break;
        case 8: _t->setupViewport((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 9: _t->d_func()->_q_deactivateAllWindows(); break;
        case 10: _t->d_func()->_q_processWindowStateChanged((*reinterpret_cast< std::add_pointer_t<Qt::WindowStates>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::WindowStates>>(_a[2]))); break;
        case 11: _t->d_func()->_q_currentTabChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 12: _t->d_func()->_q_closeTab((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 13: _t->d_func()->_q_moveTab((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMdiArea::*)(QMdiSubWindow * )>(_a, &QMdiArea::subWindowActivated, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QBrush*>(_v) = _t->background(); break;
        case 1: *reinterpret_cast<WindowOrder*>(_v) = _t->activationOrder(); break;
        case 2: *reinterpret_cast<ViewMode*>(_v) = _t->viewMode(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->documentMode(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->tabsClosable(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->tabsMovable(); break;
        case 6: *reinterpret_cast<QTabWidget::TabShape*>(_v) = _t->tabShape(); break;
        case 7: *reinterpret_cast<QTabWidget::TabPosition*>(_v) = _t->tabPosition(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setBackground(*reinterpret_cast<QBrush*>(_v)); break;
        case 1: _t->setActivationOrder(*reinterpret_cast<WindowOrder*>(_v)); break;
        case 2: _t->setViewMode(*reinterpret_cast<ViewMode*>(_v)); break;
        case 3: _t->setDocumentMode(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setTabsClosable(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setTabsMovable(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setTabShape(*reinterpret_cast<QTabWidget::TabShape*>(_v)); break;
        case 7: _t->setTabPosition(*reinterpret_cast<QTabWidget::TabPosition*>(_v)); break;
        default: break;
        }
    }
}